

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)30,_(unsigned_short)16>::Pack
               (uint64_t *in,uint32_t *out)

{
  uint64_t *in_RSI;
  long in_RDI;
  uint32_t *in_stack_ffffffffffffffe8;
  
  std::enable_if<(((unsigned_short)30)+((unsigned_short)0))<(32),void>::type_duckdb_fastpforlib::
  internal::pack_single_in64<(unsigned_short)30,(unsigned_short)0,1073741823ul>
            (*(uint64_t *)(in_RDI + 0x80),(uint32_t *)in_RSI);
  Unroller<(unsigned_short)30,_(unsigned_short)17>::Pack(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Pack(const uint64_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in64<DELTA, (DELTA * OINDEX) % 32, (1ULL << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}